

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeCommand,string *makeProgram,string *param_3,string *param_4,string *targetName,
          string *param_6,bool fast,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  cmake *pcVar3;
  pointer pcVar4;
  Snapshot snapshot_00;
  undefined8 uVar5;
  int iVar6;
  char *pcVar7;
  cmMakefile *this_00;
  string tname;
  cmOutputConverter conv;
  Snapshot snapshot;
  allocator local_b1;
  undefined1 local_b0 [40];
  string local_88;
  undefined1 local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  PositionType local_38;
  
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  cmGlobalGenerator::SelectMakeProgram
            ((string *)local_b0,(cmGlobalGenerator *)this,makeProgram,&local_88);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
            (local_b0,this);
  uVar5 = local_b0._0_8_;
  iVar6 = strncmp((char *)local_b0._0_8_,"NMake Makefiles",0xf);
  if ((undefined1 *)uVar5 != local_b0 + 0x10) {
    operator_delete((void *)uVar5,local_b0._16_8_ + 1);
  }
  if (iVar6 == 0) {
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/NOLOGO","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (makeCommand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  if (targetName->_M_string_length != 0) {
    ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar2 ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar3 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      local_68._16_8_ = (pcVar3->CurrentSnapshot).Position.Position;
      local_68._0_8_ = (pcVar3->CurrentSnapshot).State;
      local_68._8_8_ = (pcVar3->CurrentSnapshot).Position.Tree;
      cmState::Snapshot::GetDirectory((Directory *)local_b0,(Snapshot *)local_68);
      pcVar7 = cmake::GetHomeDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&local_88,pcVar7,&local_b1);
      cmState::Directory::SetCurrentSource((Directory *)local_b0,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      cmState::Snapshot::GetDirectory((Directory *)local_b0,(Snapshot *)local_68);
      pcVar7 = cmake::GetHomeOutputDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&local_88,pcVar7,&local_b1);
      cmState::Directory::SetCurrentBinary((Directory *)local_b0,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      cmState::Snapshot::SetDefaultDefinitions((Snapshot *)local_68);
      this_00 = (cmMakefile *)operator_new(0x730);
      cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)this,(Snapshot *)local_68);
    }
    else {
      this_00 = *ppcVar2;
    }
    local_b0._0_8_ = local_b0 + 0x10;
    pcVar4 = (targetName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar4,pcVar4 + targetName->_M_string_length);
    if (fast) {
      std::__cxx11::string::append(local_b0);
    }
    cmMakefile::GetStateSnapshot(this_00);
    snapshot_00.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_40;
    snapshot_00.State = (cmState *)local_48;
    snapshot_00.Position.Position = local_38;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_88,snapshot_00);
    cmOutputConverter::Convert
              ((string *)local_68,(cmOutputConverter *)&local_88,(string *)local_b0,HOME_OUTPUT,
               UNCHANGED);
    std::__cxx11::string::operator=((string *)local_b0,(string *)local_68);
    if ((cmState *)local_68._0_8_ != (cmState *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    cmSystemTools::ConvertToOutputSlashes((string *)local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(makeCommand,(value_type *)local_b0);
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmMakefile::~cmMakefile(this_00);
      operator_delete(this_00,0x730);
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::GenerateBuildCommand(std::vector<std::string>& makeCommand,
                       const std::string& makeProgram,
                       const std::string& /*projectName*/,
                       const std::string& /*projectDir*/,
                       const std::string& targetName,
                       const std::string& /*config*/,
                       bool fast, bool /*verbose*/,
                       std::vector<std::string> const& makeOptions)
{
  makeCommand.push_back(
    this->SelectMakeProgram(makeProgram)
    );

  // Since we have full control over the invocation of nmake, let us
  // make it quiet.
  if (cmHasLiteralPrefix(this->GetName(), "NMake Makefiles"))
    {
    makeCommand.push_back("/NOLOGO");
    }
  makeCommand.insert(makeCommand.end(),
                     makeOptions.begin(), makeOptions.end());
  if (!targetName.empty())
    {
    cmMakefile* mf;
    if (!this->Makefiles.empty())
      {
      mf = this->Makefiles[0];
      }
    else
      {
      cmState::Snapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();
      snapshot.GetDirectory().SetCurrentSource
        (this->CMakeInstance->GetHomeDirectory());
      snapshot.GetDirectory().SetCurrentBinary
        (this->CMakeInstance->GetHomeOutputDirectory());
      snapshot.SetDefaultDefinitions();
      mf = new cmMakefile(this, snapshot);
      }

    std::string tname = targetName;
    if(fast)
      {
      tname += "/fast";
      }
    cmOutputConverter conv(mf->GetStateSnapshot());
    tname = conv.Convert(tname,cmOutputConverter::HOME_OUTPUT);
    cmSystemTools::ConvertToOutputSlashes(tname);
    makeCommand.push_back(tname);
    if (this->Makefiles.empty())
      {
      delete mf;
      }
    }
}